

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QUrl>::data(QList<QUrl> *this)

{
  QArrayDataPointer<QUrl> *this_00;
  QUrl *pQVar1;
  QArrayDataPointer<QUrl> *in_RDI;
  
  detach((QList<QUrl> *)0x3c795c);
  this_00 = (QArrayDataPointer<QUrl> *)QArrayDataPointer<QUrl>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QUrl>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }